

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O1

void cp_expr_unary(CPState *cp,CPValue *k)

{
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar1;
  CTypeID CVar2;
  CTSize CVar3;
  CPToken CVar4;
  CType *ct;
  CType *pCVar5;
  GCstr *pGVar6;
  uint uVar7;
  int iVar8;
  MSize MVar9;
  CPValue k2;
  CTSize local_3c;
  CPValue local_38;
  
  iVar8 = cp->depth;
  cp->depth = iVar8 + 1;
  if (0x13 < iVar8) {
    cp_err(cp,LJ_ERR_XLEVELS);
  }
  if (cp->tok == 0x2b) {
    cp_next(cp);
    cp_expr_unary(cp,k);
    goto LAB_00155084;
  }
  if (cp->tok == 0x102) {
    *k = cp->val;
LAB_00154ea3:
    cp_next(cp);
  }
  else {
    if (cp->tok == 0x2d) {
      cp_next(cp);
      cp_expr_unary(cp,k);
      (k->field_0).i32 = -(k->field_0).i32;
      goto LAB_00155084;
    }
    if (cp->tok == 0x7e) {
      cp_next(cp);
      cp_expr_unary(cp,k);
      (k->field_0).u32 = ~(k->field_0).u32;
      goto LAB_00155084;
    }
    if (cp->tok == 0x21) {
      cp_next(cp);
      cp_expr_unary(cp,k);
      aVar1.i32._1_3_ = 0;
      aVar1.i32._0_1_ = (k->field_0).i32 == 0;
      k->field_0 = aVar1;
      k->id = 9;
      goto LAB_00155084;
    }
    if (cp->tok == 0x28) {
      cp_next(cp);
      iVar8 = cp->tok;
      if (((iVar8 - 0x10dU < 0x1d) || (iVar8 == 0x24)) ||
         ((iVar8 == 0x100 && ((cp->ct->info & 0xf0000000) == 0x70000000)))) {
        CVar2 = cp_decl_abstract(cp);
        cp_check(cp,0x29);
        cp_expr_unary(cp,k);
        k->id = CVar2;
      }
      else {
        cp_expr_comma(cp,k);
        cp_check(cp,0x29);
      }
      goto LAB_00155084;
    }
    if (cp->tok == 0x2a) {
      cp_next(cp);
      cp_expr_unary(cp,k);
      pCVar5 = lj_ctype_rawref(cp->cts,k->id);
      if ((pCVar5->info & 0xe0000000) != 0x20000000) {
        cp_err_badidx(cp,pCVar5);
      }
      (k->field_0).i32 = 0;
      uVar7 = (uint)(ushort)pCVar5->info;
    }
    else {
      if (cp->tok != 0x26) {
        if (cp->tok == 0x12a) {
          cp_next(cp);
          iVar8 = 1;
        }
        else {
          if (cp->tok != 299) {
            iVar8 = cp->tok;
            if (iVar8 == 0x101) {
              MVar9 = cp->str->len;
              while (CVar4 = cp_next(cp), CVar4 == 0x101) {
                MVar9 = MVar9 + cp->str->len;
              }
              (k->field_0).i32 = MVar9 + 1;
              k->id = 0x14;
              goto LAB_00155084;
            }
            if (iVar8 != 0x100) {
LAB_001552e8:
              cp_errmsg(cp,iVar8,LJ_ERR_XSYMBOL);
            }
            uVar7 = cp->ct->info >> 0x1c;
            if (uVar7 == 6) {
              k->field_0 = (anon_union_4_2_43a9a9ed_for_CPValue_0)(cp->val).id;
              uVar7 = (cp->val).id;
            }
            else {
              if (uVar7 == 0xc) {
                aVar1 = (anon_union_4_2_43a9a9ed_for_CPValue_0)(cp->val).id;
              }
              else {
                if (uVar7 != 0xb) goto LAB_001552e8;
                aVar1 = (anon_union_4_2_43a9a9ed_for_CPValue_0)cp->ct->size;
              }
              k->field_0 = aVar1;
              uVar7 = (uint)(ushort)cp->ct->info;
            }
            k->id = uVar7;
            goto LAB_00154ea3;
          }
          cp_next(cp);
          iVar8 = 0;
        }
        cp_expr_sizeof(cp,k,iVar8);
        goto LAB_00155084;
      }
      cp_next(cp);
      cp_expr_unary(cp,k);
      uVar7 = lj_ctype_intern(cp->cts,k->id + 0x20030000,8);
    }
    k->id = uVar7;
  }
LAB_00155084:
  do {
    if (cp->tok == 0x5b) {
      cp_next(cp);
      cp_expr_comma(cp,&local_38);
      ct = lj_ctype_rawref(cp->cts,k->id);
      if (((ct->info & 0xe0000000) != 0x20000000) &&
         (ct = lj_ctype_rawref(cp->cts,local_38.id), (ct->info & 0xe0000000) != 0x20000000)) {
        cp_err_badidx(cp,ct);
      }
      cp_check(cp,0x5d);
      (k->field_0).i32 = 0;
    }
    else {
      if ((cp->tok != 0x10c) && (cp->tok != 0x2e)) {
        cp->depth = cp->depth + -1;
        return;
      }
      pCVar5 = lj_ctype_rawref(cp->cts,k->id);
      if (cp->tok == 0x10c) {
        if ((pCVar5->info & 0xe0000000) != 0x20000000) {
          cp_err_badidx(cp,pCVar5);
        }
        pCVar5 = lj_ctype_rawref(cp->cts,pCVar5->info & 0xffff);
      }
      cp_next(cp);
      if (cp->tok != 0x100) {
        cp_err_token(cp,0x100);
      }
      if ((((pCVar5->info & 0xf0000000) != 0x10000000) || (pCVar5->size == 0xffffffff)) ||
         (ct = lj_ctype_getfieldq(cp->cts,pCVar5,cp->str,&local_3c,(CTInfo *)0x0),
         ct == (CType *)0x0)) {
LAB_00155277:
        pGVar6 = lj_ctype_repr(cp->cts->L,(CTypeID)((ulong)((long)pCVar5 - (long)cp->cts->tab) >> 4)
                               ,(GCstr *)0x0);
        cp_errmsg(cp,0,LJ_ERR_FFI_BADMEMBER,pGVar6 + 1,cp->str + 1);
      }
      uVar7 = ct->info >> 0x1c;
      if (uVar7 == 0xb) {
        CVar3 = ct->size;
      }
      else {
        CVar3 = 0;
        if (uVar7 == 10) goto LAB_00155277;
      }
      (k->field_0).i32 = CVar3;
      cp_next(cp);
    }
    k->id = (uint)(ushort)ct->info;
  } while( true );
}

Assistant:

static void cp_expr_unary(CPState *cp, CPValue *k)
{
  if (++cp->depth > CPARSE_MAX_DECLDEPTH) cp_err(cp, LJ_ERR_XLEVELS);
  cp_expr_prefix(cp, k);
  cp_expr_postfix(cp, k);
  cp->depth--;
}